

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::scan
               (OptimizeInvokes *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  ArrayNewFixed *pAVar28;
  PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_> *pPVar29;
  ulong uVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitBlock,currp);
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case IfId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pMVar25->size);
    goto LAB_00b04bba;
  case LoopId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00b0473b;
  case BreakId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitBreak,currp);
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pBVar16->condition);
    ppEVar4 = &pBVar16->value;
    goto LAB_00b04619;
  case SwitchId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSwitch,currp);
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    goto LAB_00b04619;
  case CallId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case CallIndirectId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitCallIndirect,
               currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pCVar13->target);
    uVar30 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitLocalGet,currp
              );
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitLocalSet,currp
              );
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00b049cf;
  case GlobalGetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitGlobalSet,
               currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00b0473b;
  case LoadId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00b04bd2;
  case StoreId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStore,currp);
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00b04992;
  case ConstId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitConst,currp);
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitUnary,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00b049cf;
  case BinaryId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitBinary,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00b0492c;
  case SelectId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSelect,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00b04bab;
  case DropId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00b047dc;
  case ReturnId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitReturn,currp);
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    goto LAB_00b04619;
  case MemorySizeId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitMemoryGrow,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00b047dc;
  case NopId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00b04a1a;
  case AtomicCmpxchgId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitAtomicCmpxchg,
               currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00b04a0b;
  case AtomicWaitId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitAtomicWait,
               currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00b0475f;
  case AtomicNotifyId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitAtomicNotify,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00b0492c;
  case AtomicFenceId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00b049cf;
  case SIMDReplaceId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00b0493a;
  case SIMDShuffleId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00b04bba;
  case SIMDTernaryId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00b0475f;
  case SIMDShiftId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDShift,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00b0492c;
  case SIMDLoadId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSIMDLoad,currp
              );
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00b048ba;
  case SIMDLoadStoreLaneId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00b04992:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00b04bd2;
  case MemoryInitId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitMemoryInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00b04a0b;
  case DataDropId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitDataDrop,currp
              );
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00b04bab;
  case MemoryFillId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitMemoryFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00b04bab;
  case PopId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefNull,currp)
    ;
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefIsNull,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00b047dc;
  case RefFuncId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefFunc,currp)
    ;
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefEq,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00b04bba;
  case TableGetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableGet,currp
              );
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00b0473b:
    ppEVar4 = &pGVar8->value;
    goto LAB_00b04bd2;
  case TableSetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableSet,currp
              );
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00b04a1a;
  case TableSizeId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableGrow,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00b04a1a;
  case TableFillId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableFill,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00b04a0b;
  case TableCopyId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00b04bab;
  case TableInitId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTableInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00b04a0b;
  case TryId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00b04bd2;
  case TryTableId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTryTable,currp
              );
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00b047dc;
  case ThrowId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitThrow,currp);
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case RethrowId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRethrow,currp)
    ;
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitThrowRef,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00b047dc;
  case TupleMakeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTupleMake,
               currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitTupleExtract,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00b047dc;
  case RefI31Id:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefI31,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00b047dc;
  case I31GetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitI31Get,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00b047dc;
  case CallRefId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitCallRef,currp)
    ;
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pCVar9->target);
    uVar30 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case RefTestId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefTest,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00b047dc;
  case RefCastId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefCast,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00b047dc;
  case BrOnId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00b048ba:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00b04bd2;
  case StructNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStructNew,
               currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case StructGetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStructGet,
               currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00b049cf;
  case StructSetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStructSet,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00b0492c;
  case StructRMWId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStructRMW,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00b0492c;
  case StructCmpxchgId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStructCmpxchg,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00b0475f:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar5->timeout);
LAB_00b04778:
    ppEVar4 = &pAVar5->expected;
    goto LAB_00b0493a;
  case ArrayNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayNew,currp
              );
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
LAB_00b04619:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,ppEVar4);
    return;
  case ArrayNewDataId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayNewData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00b04a1a;
  case ArrayNewElemId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayNewElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00b04a1a;
  case ArrayNewFixedId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayNewFixed,
               currp);
    pAVar28 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)(uint)(pAVar28->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar28->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayGet,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00b04bba;
  case ArraySetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArraySet,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00b04bab;
  case ArrayLenId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayLen,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00b047dc;
  case ArrayCopyId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00b04b9c;
  case ArrayFillId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00b04b9c:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00b04bab;
  case ArrayInitDataId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayInitData,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00b04231;
  case ArrayInitElemId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitArrayInitElem,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00b04231:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               (Expression **)&pAVar12->memory);
LAB_00b04a0b:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar12->replacement);
LAB_00b04a1a:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00b04bd2;
  case RefAsId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitRefAs,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00b049cf;
  case StringNewId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringNew,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringNew>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar5->timeout);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar5->expected);
    goto LAB_00b04945;
  case StringConstId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringMeasure,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00b049cf:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00b04bd2;
  case StringEncodeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringEncode,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::maybePushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pAVar5->timeout);
    goto LAB_00b04778;
  case StringConcatId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringConcat,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00b04bba;
  case StringEqId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringEq,currp
              );
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00b0492c:
    ppEVar4 = &pAVar5->expected;
LAB_00b0493a:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,ppEVar4);
LAB_00b04945:
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00b04bd2;
  case StringWTF16GetId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringWTF16Get
               ,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00b04bba;
  case StringSliceWTFId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStringSliceWTF
               ,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00b04bab:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pMVar25->size);
LAB_00b04bba:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00b04bd2;
  case ContNewId:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitContNew,currp)
    ;
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00b047dc:
    ppEVar4 = &pTVar7->body;
LAB_00b04bd2:
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&(self->
                super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
                ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>.
                super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,ppEVar4);
    return;
  case ContBindId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitContBind,currp
              );
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pCVar6->cont);
    uVar30 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case SuspendId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitSuspend,currp)
    ;
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case ResumeId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitResume,currp);
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pRVar2->cont);
    uVar30 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case ResumeThrowId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitResumeThrow,
               currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pRVar26->cont);
    uVar30 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
    break;
  case StackSwitchId:
    pPVar29 = &(self->
               super_WalkerPass<wasm::PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>_>
               ).super_PostWalker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>;
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,
               Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
              (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan,
               &pSVar3->cont);
    uVar30 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>::pushTask
                (&pPVar29->super_Walker<OptimizeInvokes,_wasm::Visitor<OptimizeInvokes,_void>_>,scan
                 ,ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }